

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser.cc
# Opt level: O3

bool __thiscall DepfileParser::Parse(DepfileParser *this,string *content,string *err)

{
  pointer *ppSVar1;
  byte *pbVar2;
  iterator iVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  DepfileParser *this_00;
  bool bVar7;
  byte bVar8;
  uint uVar9;
  __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_> _Var10;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  byte *pbVar14;
  int iVar15;
  ulong uVar16;
  byte *pbVar17;
  uint uVar18;
  byte *__src;
  size_t sVar19;
  byte *pbVar20;
  byte *pbVar21;
  bool bVar22;
  StringPiece piece;
  StringPiece local_58;
  string *local_48;
  DepfileParser *local_40;
  vector<StringPiece,std::allocator<StringPiece>> *local_38;
  
  local_48 = err;
  local_40 = this;
  if ((long)content->_M_string_length < 1) {
LAB_00124863:
    pcVar13 = (char *)local_48->_M_string_length;
    pcVar12 = "expected \':\' in depfile";
LAB_00124882:
    std::__cxx11::string::_M_replace((ulong)local_48,0,pcVar13,(ulong)pcVar12);
    return false;
  }
  __src = (byte *)(content->_M_dataplus)._M_p;
  pbVar2 = __src + content->_M_string_length;
  local_38 = (vector<StringPiece,std::allocator<StringPiece>> *)&this->ins_;
  bVar7 = false;
  bVar4 = false;
  pbVar17 = __src;
  bVar6 = true;
  pbVar14 = __src;
LAB_001243a5:
  while( true ) {
    bVar8 = *__src;
    uVar18 = (uint)__src;
    pbVar20 = __src;
    if (-1 < (char)""[bVar8]) break;
    do {
      pbVar21 = pbVar20 + 1;
      pbVar20 = pbVar20 + 1;
    } while ((char)""[*pbVar21] < '\0');
LAB_001245e9:
    sVar19 = (size_t)(int)((int)pbVar20 - uVar18);
    if (pbVar17 < __src) {
      memmove(pbVar17,__src,sVar19);
    }
    pbVar17 = pbVar17 + sVar19;
    __src = pbVar20;
  }
  pbVar21 = __src;
  if (bVar8 < 0xe) {
    if (bVar8 < 10) goto LAB_00124689;
    if (bVar8 != 10) {
      if (bVar8 != 0xd) goto LAB_00124689;
      pbVar21 = __src + 1;
      if (__src[1] != 10) goto LAB_00124817;
    }
    bVar22 = true;
LAB_0012468f:
    __src = pbVar21 + 1;
  }
  else {
    if (bVar8 < 0x25) {
      if ((bVar8 != 0x24) || (__src[1] != 0x24)) {
LAB_00124689:
        bVar22 = false;
        goto LAB_0012468f;
      }
      *pbVar17 = 0x24;
      pbVar17 = pbVar17 + 1;
      __src = __src + 2;
      goto LAB_001243a5;
    }
    if (0x1c < (byte)(bVar8 - 0x40)) goto LAB_00124689;
    pbVar21 = __src + 1;
    bVar8 = __src[1];
    pbVar20 = pbVar21;
    if (0x20 < bVar8) {
      if (bVar8 < 0x3a) {
LAB_00124427:
        pbVar20 = pbVar21;
        if (bVar8 == 0x23) {
          lVar11 = (long)(pbVar21 + 1) - (long)__src;
          iVar15 = (int)lVar11;
          if ((2 < iVar15) && (pbVar17 < __src)) {
            memset(pbVar17,0x5c,(ulong)(iVar15 - 2));
          }
          pbVar17[(lVar11 << 0x20) + -0x200000000 >> 0x20] = 0x23;
          pbVar17 = pbVar17 + ((lVar11 << 0x20) + -0x200000000 >> 0x20) + 1;
          __src = pbVar21 + 1;
          goto LAB_001243a5;
        }
      }
      else {
        if (bVar8 == 0x3a) {
LAB_00124561:
          pbVar20 = pbVar21 + 1;
          bVar8 = pbVar21[1];
          uVar9 = (uint)bVar8;
          if (bVar8 < 0xd) {
            if ((uVar9 < 0xb) && ((0x601U >> (uVar9 & 0x1f) & 1) != 0)) {
LAB_0012479d:
              sVar19 = (size_t)(int)(~uVar18 + (int)(pbVar21 + 2));
              if (pbVar17 < __src) {
                memmove(pbVar17,__src,sVar19);
                bVar8 = *pbVar20;
              }
              pbVar17 = pbVar17 + sVar19;
              bVar22 = bVar8 == 10;
              __src = pbVar21 + 2;
              goto LAB_00124692;
            }
          }
          else if ((bVar8 == 0xd) || (uVar9 == 0x20)) goto LAB_0012479d;
          iVar15 = (int)((long)pbVar20 - (long)__src);
          if ((2 < iVar15) && (pbVar17 < __src)) {
            memset(pbVar17,0x5c,(ulong)(iVar15 - 2));
          }
          pbVar17[((long)pbVar20 - (long)__src << 0x20) + -0x200000000 >> 0x20] = 0x3a;
          pbVar17 = pbVar17 + (((long)pbVar20 - (long)__src << 0x20) + -0x200000000 >> 0x20) + 1;
          __src = pbVar20;
          goto LAB_001243a5;
        }
        if (bVar8 == 0x5c) {
          lVar11 = 0x200000000;
          pbVar20 = __src + 3;
          do {
            pbVar21 = pbVar20;
            bVar8 = pbVar21[-1];
            if (bVar8 < 0x21) {
              pbVar20 = pbVar21 + -1;
              if (bVar8 < 0xb) {
                pbVar21 = pbVar20;
                if (bVar8 == 0) goto LAB_001245e9;
LAB_00124630:
                pbVar20 = pbVar21;
                if (bVar8 == 10) goto LAB_001245e9;
                goto LAB_001245e6;
              }
              if (bVar8 == 0xd) goto LAB_001245e9;
              if (bVar8 != 0x20) goto LAB_001245e6;
              if (pbVar17 < __src) {
                memset(pbVar17,0x5c,lVar11 >> 0x20);
              }
              pbVar17 = pbVar17 + (lVar11 >> 0x20);
              bVar22 = false;
              __src = pbVar21;
              goto LAB_00124692;
            }
            if (bVar8 < 0x3a) {
              pbVar21 = pbVar21 + -1;
              goto LAB_00124427;
            }
            if (bVar8 != 0x5c) {
              pbVar21 = pbVar21 + -1;
              break;
            }
            bVar8 = *pbVar21;
            if (bVar8 < 0x21) {
              pbVar20 = pbVar21;
              if (bVar8 < 0xb) {
                if (bVar8 != 0) goto LAB_00124630;
                goto LAB_001245e9;
              }
              if (bVar8 == 0xd) goto LAB_001245e9;
              if (bVar8 == 0x20) goto LAB_00124514;
              goto LAB_001245e6;
            }
            if (bVar8 < 0x3a) goto LAB_00124427;
            lVar11 = lVar11 + 0x200000000;
            pbVar20 = pbVar21 + 2;
          } while (bVar8 == 0x5c);
          pbVar20 = pbVar21;
          if (bVar8 == 0x3a) goto LAB_00124561;
        }
      }
LAB_001245e6:
      pbVar20 = pbVar20 + 1;
      goto LAB_001245e9;
    }
    if (bVar8 < 0xb) {
      if (bVar8 != 0) {
        if (bVar8 != 10) goto LAB_001245e6;
        lVar11 = 1;
LAB_00124810:
        pbVar21 = __src + lVar11 + 1;
      }
    }
    else {
      if (bVar8 == 0x20) {
LAB_00124514:
        sVar19 = (long)((int)((int)(pbVar21 + 1) - uVar18) / 2) - 1;
        if (pbVar17 < __src) {
          memset(pbVar17,0x5c,sVar19);
        }
        pbVar17[sVar19] = 0x20;
        pbVar17 = pbVar17 + sVar19 + 1;
        __src = pbVar21 + 1;
        goto LAB_001243a5;
      }
      if (bVar8 != 0xd) goto LAB_001245e6;
      lVar11 = 2;
      if (__src[2] == 10) goto LAB_00124810;
    }
LAB_00124817:
    bVar22 = false;
    __src = pbVar21;
  }
LAB_00124692:
  this_00 = local_40;
  uVar16 = (long)pbVar17 - (long)pbVar14;
  iVar15 = (int)uVar16;
  pbVar17 = __src;
  if (0 < iVar15) {
    bVar5 = bVar6;
    if (pbVar14[iVar15 - 1] == 0x3a) {
      uVar16 = (ulong)(iVar15 - 1U);
      if (iVar15 - 1U != 0) {
        bVar7 = true;
        bVar5 = false;
        goto LAB_001246d3;
      }
      bVar4 = (bool)(bVar4 & (bVar22 ^ 1U));
      bVar7 = true;
      bVar6 = bVar22;
      pbVar14 = __src;
      if (pbVar2 <= __src) {
        return true;
      }
      goto LAB_001243a5;
    }
LAB_001246d3:
    local_58.len_ = uVar16 & 0xffffffff;
    local_58.str_ = (char *)pbVar14;
    _Var10 = std::
             __find_if<__gnu_cxx::__normal_iterator<StringPiece*,std::vector<StringPiece,std::allocator<StringPiece>>>,__gnu_cxx::__ops::_Iter_equals_val<StringPiece_const>>
                       ((local_40->ins_).
                        super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (local_40->ins_).
                        super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                        super__Vector_impl_data._M_finish,&local_58);
    iVar3._M_current =
         (this_00->ins_).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (_Var10._M_current == iVar3._M_current) {
      if (!bVar6) {
        if (!bVar4) {
          if (_Var10._M_current ==
              (this_00->ins_).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<StringPiece,std::allocator<StringPiece>>::
            _M_realloc_insert<StringPiece_const&>(local_38,iVar3,&local_58);
          }
          else {
            (iVar3._M_current)->str_ = local_58.str_;
            (iVar3._M_current)->len_ = local_58.len_;
            ppSVar1 = &(this_00->ins_).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppSVar1 = *ppSVar1 + 1;
          }
          bVar4 = false;
          bVar6 = bVar5;
          goto LAB_001247e5;
        }
        pcVar13 = (char *)local_48->_M_string_length;
        pcVar12 = "inputs may not also have inputs";
        goto LAB_00124882;
      }
      _Var10 = std::
               __find_if<__gnu_cxx::__normal_iterator<StringPiece*,std::vector<StringPiece,std::allocator<StringPiece>>>,__gnu_cxx::__ops::_Iter_equals_val<StringPiece_const>>
                         ((this_00->outs_).
                          super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (this_00->outs_).
                          super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                          super__Vector_impl_data._M_finish,&local_58);
      iVar3._M_current =
           (this_00->outs_).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
           super__Vector_impl_data._M_finish;
      bVar6 = bVar5;
      if (_Var10._M_current == iVar3._M_current) {
        if (_Var10._M_current ==
            (this_00->outs_).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<StringPiece,std::allocator<StringPiece>>::
          _M_realloc_insert<StringPiece_const&>
                    ((vector<StringPiece,std::allocator<StringPiece>> *)this_00,iVar3,&local_58);
        }
        else {
          (iVar3._M_current)->str_ = local_58.str_;
          (iVar3._M_current)->len_ = local_58.len_;
          ppSVar1 = &(this_00->outs_).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + 1;
        }
      }
    }
    else {
      bVar4 = (bool)(bVar6 | bVar4);
      bVar6 = bVar5;
    }
  }
LAB_001247e5:
  bVar4 = (bool)(bVar4 & (bVar22 ^ 1U));
  bVar6 = (bool)(bVar6 | bVar22);
  pbVar14 = __src;
  if (pbVar2 <= __src) {
    if (bVar7) {
      return true;
    }
    goto LAB_00124863;
  }
  goto LAB_001243a5;
}

Assistant:

bool DepfileParser::Parse(string* content, string* err) {
  // in: current parser input point.
  // end: end of input.
  // parsing_targets: whether we are parsing targets or dependencies.
  char* in = &(*content)[0];
  char* end = in + content->size();
  bool have_target = false;
  bool parsing_targets = true;
  bool poisoned_input = false;
  while (in < end) {
    bool have_newline = false;
    // out: current output point (typically same as in, but can fall behind
    // as we de-escape backslashes).
    char* out = in;
    // filename: start of the current parsed filename.
    char* filename = out;
    for (;;) {
      // start: beginning of the current parsed span.
      const char* start = in;
      char* yymarker = NULL;
      
    {
      unsigned char yych;
      static const unsigned char yybm[] = {
          0,   0,   0,   0,   0,   0,   0,   0, 
          0,   0,   0,   0,   0,   0,   0,   0, 
          0,   0,   0,   0,   0,   0,   0,   0, 
          0,   0,   0,   0,   0,   0,   0,   0, 
          0, 128,   0,   0,   0, 128,   0,   0, 
        128, 128,   0, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128,   0,   0, 128,   0,   0, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128,   0, 128,   0, 128, 
          0, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128,   0, 128, 128,   0, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
      };
      yych = *in;
      if (yybm[0+yych] & 128) {
        goto yy9;
      }
      if (yych <= '\r') {
        if (yych <= '\t') {
          if (yych >= 0x01) goto yy4;
        } else {
          if (yych <= '\n') goto yy6;
          if (yych <= '\f') goto yy4;
          goto yy8;
        }
      } else {
        if (yych <= '$') {
          if (yych <= '#') goto yy4;
          goto yy12;
        } else {
          if (yych <= '?') goto yy4;
          if (yych <= '\\') goto yy13;
          goto yy4;
        }
      }
      ++in;
      {
        break;
      }
yy4:
      ++in;
yy5:
      {
        // For any other character (e.g. whitespace), swallow it here,
        // allowing the outer logic to loop around again.
        break;
      }
yy6:
      ++in;
      {
        // A newline ends the current file name and the current rule.
        have_newline = true;
        break;
      }
yy8:
      yych = *++in;
      if (yych == '\n') goto yy6;
      goto yy5;
yy9:
      yych = *++in;
      if (yybm[0+yych] & 128) {
        goto yy9;
      }
yy11:
      {
        // Got a span of plain text.
        int len = (int)(in - start);
        // Need to shift it over if we're overwriting backslashes.
        if (out < start)
          memmove(out, start, len);
        out += len;
        continue;
      }
yy12:
      yych = *++in;
      if (yych == '$') goto yy14;
      goto yy5;
yy13:
      yych = *(yymarker = ++in);
      if (yych <= ' ') {
        if (yych <= '\n') {
          if (yych <= 0x00) goto yy5;
          if (yych <= '\t') goto yy16;
          goto yy17;
        } else {
          if (yych == '\r') goto yy19;
          if (yych <= 0x1F) goto yy16;
          goto yy21;
        }
      } else {
        if (yych <= '9') {
          if (yych == '#') goto yy23;
          goto yy16;
        } else {
          if (yych <= ':') goto yy25;
          if (yych == '\\') goto yy27;
          goto yy16;
        }
      }
yy14:
      ++in;
      {
        // De-escape dollar character.
        *out++ = '$';
        continue;
      }
yy16:
      ++in;
      goto yy11;
yy17:
      ++in;
      {
        // A line continuation ends the current file name.
        break;
      }
yy19:
      yych = *++in;
      if (yych == '\n') goto yy17;
      in = yymarker;
      goto yy5;
yy21:
      ++in;
      {
        // 2N+1 backslashes plus space -> N backslashes plus space.
        int len = (int)(in - start);
        int n = len / 2 - 1;
        if (out < start)
          memset(out, '\\', n);
        out += n;
        *out++ = ' ';
        continue;
      }
yy23:
      ++in;
      {
        // De-escape hash sign, but preserve other leading backslashes.
        int len = (int)(in - start);
        if (len > 2 && out < start)
          memset(out, '\\', len - 2);
        out += len - 2;
        *out++ = '#';
        continue;
      }
yy25:
      yych = *++in;
      if (yych <= '\f') {
        if (yych <= 0x00) goto yy28;
        if (yych <= 0x08) goto yy26;
        if (yych <= '\n') goto yy28;
      } else {
        if (yych <= '\r') goto yy28;
        if (yych == ' ') goto yy28;
      }
yy26:
      {
        // De-escape colon sign, but preserve other leading backslashes.
        // Regular expression uses lookahead to make sure that no whitespace
        // nor EOF follows. In that case it'd be the : at the end of a target
        int len = (int)(in - start);
        if (len > 2 && out < start)
          memset(out, '\\', len - 2);
        out += len - 2;
        *out++ = ':';
        continue;
      }
yy27:
      yych = *++in;
      if (yych <= ' ') {
        if (yych <= '\n') {
          if (yych <= 0x00) goto yy11;
          if (yych <= '\t') goto yy16;
          goto yy11;
        } else {
          if (yych == '\r') goto yy11;
          if (yych <= 0x1F) goto yy16;
          goto yy30;
        }
      } else {
        if (yych <= '9') {
          if (yych == '#') goto yy23;
          goto yy16;
        } else {
          if (yych <= ':') goto yy25;
          if (yych == '\\') goto yy32;
          goto yy16;
        }
      }
yy28:
      ++in;
      {
        // Backslash followed by : and whitespace.
        // It is therefore normal text and not an escaped colon
        int len = (int)(in - start - 1);
        // Need to shift it over if we're overwriting backslashes.
        if (out < start)
          memmove(out, start, len);
        out += len;
        if (*(in - 1) == '\n')
          have_newline = true;
        break;
      }
yy30:
      ++in;
      {
        // 2N backslashes plus space -> 2N backslashes, end of filename.
        int len = (int)(in - start);
        if (out < start)
          memset(out, '\\', len - 1);
        out += len - 1;
        break;
      }
yy32:
      yych = *++in;
      if (yych <= ' ') {
        if (yych <= '\n') {
          if (yych <= 0x00) goto yy11;
          if (yych <= '\t') goto yy16;
          goto yy11;
        } else {
          if (yych == '\r') goto yy11;
          if (yych <= 0x1F) goto yy16;
          goto yy21;
        }
      } else {
        if (yych <= '9') {
          if (yych == '#') goto yy23;
          goto yy16;
        } else {
          if (yych <= ':') goto yy25;
          if (yych == '\\') goto yy27;
          goto yy16;
        }
      }
    }

    }

    int len = (int)(out - filename);
    const bool is_dependency = !parsing_targets;
    if (len > 0 && filename[len - 1] == ':') {
      len--;  // Strip off trailing colon, if any.
      parsing_targets = false;
      have_target = true;
    }

    if (len > 0) {
      StringPiece piece = StringPiece(filename, len);
      // If we've seen this as an input before, skip it.
      std::vector<StringPiece>::iterator pos = std::find(ins_.begin(), ins_.end(), piece);
      if (pos == ins_.end()) {
        if (is_dependency) {
          if (poisoned_input) {
            *err = "inputs may not also have inputs";
            return false;
          }
          // New input.
          ins_.push_back(piece);
        } else {
          // Check for a new output.
          if (std::find(outs_.begin(), outs_.end(), piece) == outs_.end())
            outs_.push_back(piece);
        }
      } else if (!is_dependency) {
        // We've passed an input on the left side; reject new inputs.
        poisoned_input = true;
      }
    }

    if (have_newline) {
      // A newline ends a rule so the next filename will be a new target.
      parsing_targets = true;
      poisoned_input = false;
    }
  }
  if (!have_target) {
    *err = "expected ':' in depfile";
    return false;
  }
  return true;
}